

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
Operations::UsedBy(Operations *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args)

{
  pointer pbVar1;
  _Hash_node_base *p_Var2;
  ostream *poVar3;
  iterator iVar4;
  _Hash_node_base *p_Var5;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  pointer __rhs;
  _Hash_node_base *p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  LoadProject(this,false);
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"No files specified to find usage of...\n",0x27);
  }
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != pbVar1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File ",5);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(__rhs->_M_dataplus)._M_p,__rhs->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," is used by:\n",0xd);
      std::operator+(&local_50,"./",__rhs);
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->files)._M_h,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      p_Var7 = (this->files)._M_h._M_before_begin._M_nxt;
      if (p_Var7 != (_Hash_node_base *)0x0) {
        p_Var9 = (_Hash_node_base *)
                 ((long)iVar4.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                        ._M_cur + 0x28);
        do {
          uVar6 = (ulong)p_Var9 % (ulong)p_Var7[0x10]._M_nxt;
          p_Var2 = p_Var7[0xf]._M_nxt[uVar6]._M_nxt;
          p_Var5 = (_Hash_node_base *)0x0;
          if ((p_Var2 != (_Hash_node_base *)0x0) &&
             (p_Var5 = p_Var2, p_Var8 = p_Var2->_M_nxt, p_Var9 != p_Var2->_M_nxt[1]._M_nxt)) {
            while (p_Var2 = p_Var8->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
              p_Var5 = (_Hash_node_base *)0x0;
              if (((ulong)p_Var2[1]._M_nxt % (ulong)p_Var7[0x10]._M_nxt != uVar6) ||
                 (p_Var5 = p_Var8, p_Var8 = p_Var2, p_Var9 == p_Var2[1]._M_nxt)) goto LAB_0011a991;
            }
            p_Var5 = (_Hash_node_base *)0x0;
          }
LAB_0011a991:
          if ((p_Var5 != (_Hash_node_base *)0x0) && (p_Var5->_M_nxt != (_Hash_node_base *)0x0)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)p_Var7[5]._M_nxt,
                                (long)p_Var7[6]._M_nxt);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          }
          p_Var7 = p_Var7->_M_nxt;
        } while (p_Var7 != (_Hash_node_base *)0x0);
      }
      __rhs = __rhs + 1;
    } while (__rhs != pbVar1);
  }
  return;
}

Assistant:

void UsedBy(std::vector<std::string> args) {
        LoadProject();
        if (args.empty())
            std::cout << "No files specified to find usage of...\n";
        for (auto& s : args) {
            std::cout << "File " << s << " is used by:\n";
            File* f = &files.find("./" + s)->second;
            for (auto &p : files) {
                if (p.second.dependencies.find(f) != p.second.dependencies.end()) {
                    std::cout << "  " << p.second.path.string() << "\n";
                }
            }
        }
    }